

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_mesh.cpp
# Opt level: O2

void __thiscall
polyscope::VolumeMesh::VolumeMesh
          (VolumeMesh *this,string *name,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *vertexPositions_,
          vector<std::array<unsigned_int,_8UL>,_std::allocator<std::array<unsigned_int,_8UL>_>_>
          *cellIndices_)

{
  ManagedBufferRegistry *registry_;
  undefined1 *this_00;
  double dVar1;
  undefined1 auVar2 [64];
  undefined1 auVar4 [16];
  vec3 vVar5;
  vec3 hsv;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *local_190;
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_> *local_188;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *local_180;
  vector<std::array<unsigned_int,_8UL>,_std::allocator<std::array<unsigned_int,_8UL>_>_> *local_178;
  ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *local_170;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *local_168;
  vector<float,_std::allocator<float>_> *local_160;
  ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *local_158;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *local_150;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *local_148;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_140;
  ManagedBuffer<float> *local_138;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_130;
  ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *local_128;
  ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *local_120;
  ManagedBuffer<unsigned_int> *local_118;
  ManagedBuffer<unsigned_int> *local_110;
  ManagedBuffer<unsigned_int> *local_108;
  undefined1 *local_100;
  undefined **local_f8;
  undefined1 *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  function<void_()> local_c8;
  _Bind<void_(polyscope::VolumeMesh::*(polyscope::VolumeMesh_*))()> local_a8;
  function<void_()> local_90;
  string local_70;
  string local_50;
  undefined1 auVar3 [56];
  
  local_f0 = &this->field_0xed0;
  WeakReferrable::WeakReferrable((WeakReferrable *)local_f0);
  (this->super_QuantityStructure<polyscope::VolumeMesh>).super_Structure._vptr_Structure =
       (_func_int **)0x598598;
  *(undefined8 *)&this->field_0xed0 = 0x598638;
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  (*(this->super_QuantityStructure<polyscope::VolumeMesh>).super_Structure._vptr_Structure[0xd])
            (&local_70,this);
  QuantityStructure<polyscope::VolumeMesh>::QuantityStructure
            (&this->super_QuantityStructure<polyscope::VolumeMesh>,
             &PTR_construction_vtable_24__00598650,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_QuantityStructure<polyscope::VolumeMesh>).super_Structure._vptr_Structure =
       (_func_int **)0x598598;
  *(undefined8 *)&this->field_0xed0 = 0x598638;
  local_f8 = &PTR_construction_vtable_24__00598650;
  Structure::uniquePrefix_abi_cxx11_(&local_1d0,(Structure *)this);
  std::operator+(&local_1b0,&local_1d0,"vertexPositions");
  this_00 = &(this->super_QuantityStructure<polyscope::VolumeMesh>).field_0x428;
  registry_ = &(this->super_QuantityStructure<polyscope::VolumeMesh>).super_Structure.
               super_ManagedBufferRegistry;
  local_190 = &this->vertexPositionsData;
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ManagedBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)this_00,registry_,&local_1b0,
             local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  local_100 = this_00;
  Structure::uniquePrefix_abi_cxx11_(&local_1d0,(Structure *)this);
  std::operator+(&local_1b0,&local_1d0,"triangleVertexInds");
  local_108 = &this->triangleVertexInds;
  render::ManagedBuffer<unsigned_int>::ManagedBuffer
            (local_108,registry_,&local_1b0,&this->triangleVertexIndsData);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  Structure::uniquePrefix_abi_cxx11_(&local_1d0,(Structure *)this);
  std::operator+(&local_1b0,&local_1d0,"triangleFaceInds");
  local_110 = &this->triangleFaceInds;
  local_130 = &this->triangleFaceIndsData;
  render::ManagedBuffer<unsigned_int>::ManagedBuffer(local_110,registry_,&local_1b0,local_130);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  Structure::uniquePrefix_abi_cxx11_(&local_1d0,(Structure *)this);
  std::operator+(&local_1b0,&local_1d0,"triangleCellInds");
  local_118 = &this->triangleCellInds;
  local_140 = &this->triangleCellIndsData;
  render::ManagedBuffer<unsigned_int>::ManagedBuffer(local_118,registry_,&local_1b0,local_140);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  Structure::uniquePrefix_abi_cxx11_(&local_1d0,(Structure *)this);
  std::operator+(&local_1b0,&local_1d0,"baryCoord");
  local_120 = &this->baryCoord;
  local_148 = &this->baryCoordData;
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ManagedBuffer
            (local_120,registry_,&local_1b0,local_148);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  Structure::uniquePrefix_abi_cxx11_(&local_1d0,(Structure *)this);
  std::operator+(&local_1b0,&local_1d0,"edgeIsReal");
  local_128 = &this->edgeIsReal;
  local_150 = &this->edgeIsRealData;
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ManagedBuffer
            (local_128,registry_,&local_1b0,local_150);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  Structure::uniquePrefix_abi_cxx11_(&local_1d0,(Structure *)this);
  std::operator+(&local_1b0,&local_1d0,"faceType");
  local_138 = &this->faceType;
  local_160 = &this->faceTypeData;
  render::ManagedBuffer<float>::ManagedBuffer(local_138,registry_,&local_1b0,local_160);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  Structure::uniquePrefix_abi_cxx11_(&local_1d0,(Structure *)this);
  std::operator+(&local_1b0,&local_1d0,"faceNormals");
  local_a8._M_f = (offset_in_VolumeMesh_to_subr)computeFaceNormals;
  local_a8._8_8_ = 0;
  local_a8._M_bound_args.super__Tuple_impl<0UL,_polyscope::VolumeMesh_*>.
  super__Head_base<0UL,_polyscope::VolumeMesh_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_polyscope::VolumeMesh_*>)(_Tuple_impl<0UL,_polyscope::VolumeMesh_*>)this;
  std::function<void()>::
  function<std::_Bind<void(polyscope::VolumeMesh::*(polyscope::VolumeMesh*))()>,void>
            ((function<void()> *)&local_90,&local_a8);
  local_158 = &this->faceNormals;
  local_168 = &this->faceNormalsData;
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ManagedBuffer
            (local_158,registry_,&local_1b0,local_168,&local_90);
  std::_Function_base::~_Function_base(&local_90.super__Function_base);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  Structure::uniquePrefix_abi_cxx11_(&local_1d0,(Structure *)this);
  std::operator+(&local_1b0,&local_1d0,"cellCenters");
  local_a8._M_f = (offset_in_VolumeMesh_to_subr)computeCellCenters;
  local_a8._8_8_ = 0;
  local_a8._M_bound_args.super__Tuple_impl<0UL,_polyscope::VolumeMesh_*>.
  super__Head_base<0UL,_polyscope::VolumeMesh_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_polyscope::VolumeMesh_*>)(_Tuple_impl<0UL,_polyscope::VolumeMesh_*>)this;
  std::function<void()>::
  function<std::_Bind<void(polyscope::VolumeMesh::*(polyscope::VolumeMesh*))()>,void>
            ((function<void()> *)&local_c8,&local_a8);
  local_170 = &this->cellCenters;
  local_180 = &this->cellCentersData;
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ManagedBuffer
            (local_170,registry_,&local_1b0,local_180,&local_c8);
  std::_Function_base::~_Function_base(&local_c8.super__Function_base);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  local_178 = &this->cells;
  std::vector<std::array<unsigned_int,_8UL>,_std::allocator<std::array<unsigned_int,_8UL>_>_>::
  vector(local_178,cellIndices_);
  (this->volumeSlicePlaneListeners).
  super__Vector_base<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->faceIsInterior).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->faceIsInterior).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->faceIsInterior).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tets).
  super__Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tets).
  super__Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tets).
  super__Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->volumeSlicePlaneListeners).
  super__Vector_base<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->volumeSlicePlaneListeners).
  super__Vector_base<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector(local_190,vertexPositions_);
  (this->faceTypeData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->faceTypeData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->faceNormalsData).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->faceNormalsData).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->faceNormalsData).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cellCentersData).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cellCentersData).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cellCentersData).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->triangleCellIndsData).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->baryCoordData).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->baryCoordData).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->baryCoordData).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->edgeIsRealData).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->edgeIsRealData).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edgeIsRealData).
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->faceTypeData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->triangleVertexIndsData).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->triangleVertexIndsData).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->triangleVertexIndsData).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->triangleFaceIndsData).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->triangleFaceIndsData).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->triangleFaceIndsData).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->triangleCellIndsData).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->triangleCellIndsData).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Structure::uniquePrefix_abi_cxx11_(&local_1d0,(Structure *)this);
  std::operator+(&local_1b0,&local_1d0,"color");
  vVar5 = getNextUniqueColor();
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::PersistentValue
            (&this->color,&local_1b0,vVar5);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  local_188 = &this->color;
  Structure::uniquePrefix_abi_cxx11_(&local_1d0,(Structure *)this);
  std::operator+(&local_1b0,&local_1d0,"interiorColor");
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::PersistentValue
            (&this->interiorColor,&local_1b0,(this->color).value);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  Structure::uniquePrefix_abi_cxx11_(&local_1d0,(Structure *)this);
  std::operator+(&local_1b0,&local_1d0,"edgeColor");
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::PersistentValue
            (&this->edgeColor,&local_1b0,(vec<3,_float,_(glm::qualifier)0>)ZEXT812(0));
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  Structure::uniquePrefix_abi_cxx11_(&local_1d0,(Structure *)this);
  std::operator+(&local_1b0,&local_1d0,"material");
  std::__cxx11::string::string((string *)&local_e8,"clay",(allocator *)&local_a8);
  PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::PersistentValue(&this->material,&local_1b0,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  Structure::uniquePrefix_abi_cxx11_(&local_1d0,(Structure *)this);
  std::operator+(&local_1b0,&local_1d0,"edgeWidth");
  PersistentValue<float>::PersistentValue(&this->edgeWidth,&local_1b0,0.0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  this->activeLevelSetQuantity = (VolumeMeshVertexScalarQuantity *)0x0;
  (this->program).super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->program).super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->pickProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->pickProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->pickProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->pickProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->nFacesTriangulationCount = 0;
  this->nFacesCount = 0;
  PersistentValue<bool>::setPassive
            (&(this->super_QuantityStructure<polyscope::VolumeMesh>).super_Structure.
              cullWholeElements,true);
  vVar5.field_0 = (this->color).value.field_0;
  vVar5.field_1 = (this->color).value.field_1;
  vVar5.field_2 = (this->color).value.field_2;
  auVar3 = ZEXT856(0);
  vVar5 = RGBtoHSV(vVar5);
  hsv.field_2 = vVar5.field_2;
  auVar2._0_8_ = vVar5._0_8_;
  auVar2._8_56_ = auVar3;
  auVar4 = vmovshdup_avx(auVar2._0_16_);
  dVar1 = (double)auVar4._0_4_ * 0.3;
  auVar4._0_4_ = (float)dVar1;
  auVar4._4_4_ = (int)((ulong)dVar1 >> 0x20);
  auVar4._8_8_ = 0;
  auVar4 = vinsertps_avx(auVar2._0_16_,auVar4,0x10);
  hsv._0_8_ = auVar4._0_8_;
  vVar5 = HSVtoRGB(hsv);
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::setPassive(&this->interiorColor,vVar5);
  computeCounts(this);
  computeConnectivityData(this);
  (*(this->super_QuantityStructure<polyscope::VolumeMesh>).super_Structure._vptr_Structure[0x10])
            (this);
  return;
}

Assistant:

VolumeMesh::VolumeMesh(std::string name, const std::vector<glm::vec3>& vertexPositions_,
                       const std::vector<std::array<uint32_t, 8>>& cellIndices_)
    : QuantityStructure<VolumeMesh>(name, typeName()),
      // clang-format off

// == managed quantities

// positions
vertexPositions(        this, uniquePrefix() + "vertexPositions",     vertexPositionsData),

// connectivity / indices
triangleVertexInds(     this, uniquePrefix() + "triangleVertexInds",  triangleVertexIndsData),
triangleFaceInds(       this, uniquePrefix() + "triangleFaceInds",    triangleFaceIndsData),
triangleCellInds(       this, uniquePrefix() + "triangleCellInds",    triangleCellIndsData),

// internal triangle data for rendering
baryCoord(              this, uniquePrefix() + "baryCoord",           baryCoordData),
edgeIsReal(             this, uniquePrefix() + "edgeIsReal",          edgeIsRealData),
faceType(               this, uniquePrefix() + "faceType",            faceTypeData),

// other internally-computed geometry
faceNormals(            this, uniquePrefix() + "faceNormals",         faceNormalsData,        std::bind(&VolumeMesh::computeFaceNormals, this)),
cellCenters(            this, uniquePrefix() + "cellCenters",         cellCentersData,        std::bind(&VolumeMesh::computeCellCenters, this)),         


// == core input data
cells(cellIndices_),
vertexPositionsData(vertexPositions_), 

// == persistent options
color(uniquePrefix() + "color", getNextUniqueColor()),
interiorColor(uniquePrefix() + "interiorColor", color.get()),
edgeColor(uniquePrefix() + "edgeColor", glm::vec3{0., 0., 0.}), 
material(uniquePrefix() + "material", "clay"),
edgeWidth(uniquePrefix() + "edgeWidth", 0.), 

// == misc values
activeLevelSetQuantity(nullptr) 
{
  // clang-format on

  cullWholeElements.setPassive(true);

  // set the interior color to be a desaturated version of the normal one
  glm::vec3 desatColorHSV = RGBtoHSV(color.get());
  desatColorHSV.y *= 0.3;
  interiorColor.setPassive(HSVtoRGB(desatColorHSV));

  computeCounts();
  computeConnectivityData();
  updateObjectSpaceBounds();
}